

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O0

int get_read_type(coda_cursor_conflict *cursor,coda_native_type *read_type)

{
  long *in_FS_OFFSET;
  coda_type *local_28;
  coda_type *type;
  coda_native_type *read_type_local;
  coda_cursor_conflict *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_28 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_28 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  if ((((local_28->type_class == 2) || (local_28->type_class == 3)) &&
      (*(int *)(*in_FS_OFFSET + -0x1204) != 0)) && (local_28[1].name != (char *)0x0)) {
    *read_type = coda_native_type_double;
  }
  else {
    *read_type = local_28->read_type;
  }
  return 0;
}

Assistant:

static int get_read_type(const coda_cursor *cursor, coda_native_type *read_type)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    if ((type->type_class == coda_integer_class || type->type_class == coda_real_class) &&
        coda_option_perform_conversions && ((coda_type_number *)type)->conversion != NULL)
    {
        *read_type = coda_native_type_double;
    }
    else
    {
        *read_type = type->read_type;
    }

    return 0;
}